

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void soul::SanityCheckPass::throwErrorIfMultidimensionalArray(Context *location,Type *type)

{
  size_t sVar1;
  Structure *pSVar2;
  char (*in_R9) [25];
  Member *m;
  Member *type_00;
  long lVar3;
  Type elementType;
  Type local_68;
  CompileMessage local_50;
  
  if (type->category == array) {
    Type::getArrayElementType(&local_68,type);
    if (local_68.category == array) {
      CompileMessageHelpers::createMessage<char_const(&)[25]>
                (&local_50,(CompileMessageHelpers *)0x1,none,0x26325e,"Multi-dimensional arrays",
                 in_R9);
      AST::Context::throwError(location,&local_50,false);
    }
    throwErrorIfMultidimensionalArray(location,&local_68);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_68.structure.object);
  }
  if (type->category == structure) {
    pSVar2 = Type::getStructRef(type);
    sVar1 = (pSVar2->members).numActive;
    if (sVar1 != 0) {
      type_00 = (pSVar2->members).items;
      lVar3 = sVar1 << 6;
      do {
        throwErrorIfMultidimensionalArray(location,&type_00->type);
        type_00 = type_00 + 1;
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != 0);
    }
  }
  return;
}

Assistant:

static void throwErrorIfMultidimensionalArray (const AST::Context& location, const Type& type)
    {
        if (type.isArray())
        {
            auto elementType = type.getArrayElementType();

            if (elementType.isArray())
                location.throwError (Errors::notYetImplemented ("Multi-dimensional arrays"));

            throwErrorIfMultidimensionalArray (location, elementType);
        }

        if (type.isStruct())
            for (auto& m : type.getStructRef().getMembers())
                throwErrorIfMultidimensionalArray (location, m.type);
    }